

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.h
# Opt level: O0

int ms5837_read_eeprom(MS5837 *pMS5837)

{
  int iVar1;
  BOOL BVar2;
  byte local_19;
  uint8_t i;
  MS5837 *pMS5837_local;
  
  local_19 = 0;
  while( true ) {
    if (6 < local_19) {
      BVar2 = ms5837_crc_check(pMS5837->eeprom_coeff,
                               (uint8_t)((int)(pMS5837->eeprom_coeff[0] & 0xf000) >> 0xc));
      if (BVar2 != 0) {
        pMS5837->ms5837_coeff_read = 1;
      }
      else {
        printf("Error reading data from a MS5837 : CRC error. \n");
      }
      pMS5837_local._4_4_ = (uint)(BVar2 == 0);
      return pMS5837_local._4_4_;
    }
    iVar1 = ms5837_read_eeprom_coeff
                      (pMS5837,local_19 * '\x02' + 0xa0,pMS5837->eeprom_coeff + (int)(uint)local_19)
    ;
    if (iVar1 != 0) break;
    local_19 = local_19 + 1;
  }
  printf("Error reading data from a MS5837 : ms5837_read_eeprom_coeff failed. \n");
  return 1;
}

Assistant:

inline int ms5837_read_eeprom(MS5837* pMS5837)
{
	uint8_t i = 0;

	for (i = 0; i< MS5837_COEFFICIENT_NUMBERS; i++)
	{
		if (ms5837_read_eeprom_coeff(pMS5837, MS5837_PROM_ADDRESS_READ_ADDRESS_0 + i*2, pMS5837->eeprom_coeff+i) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MS5837 : ms5837_read_eeprom_coeff failed. \n");
			return EXIT_FAILURE;
		}
	}

	if (!ms5837_crc_check(pMS5837->eeprom_coeff, (pMS5837->eeprom_coeff[MS5837_CRC_INDEX] & 0xF000)>>12))
	{
		printf("Error reading data from a MS5837 : CRC error. \n");
		return EXIT_FAILURE;
	}

	pMS5837->ms5837_coeff_read = true;

	return EXIT_SUCCESS;
}